

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_ce.cpp
# Opt level: O0

void msd_CE1(uchar **strings,size_t n,size_t depth)

{
  byte bVar1;
  uchar *puVar2;
  size_t sVar3;
  void *__ptr;
  void *__src;
  ushort local_1062;
  uchar *puStack_1060;
  unsigned_short i_3;
  size_t bsum;
  size_t i_2;
  size_t i_1;
  size_t bucketindex [256];
  uchar **sorted;
  size_t i;
  uchar *oracle;
  size_t bucketsize [256];
  size_t depth_local;
  size_t n_local;
  uchar **strings_local;
  
  if (n < 0x20) {
    insertion_sort(strings,(int)n,depth);
  }
  else {
    memset(&oracle,0,0x800);
    __ptr = malloc(n);
    for (sorted = (uchar **)0x0; sorted < n; sorted = (uchar **)((long)sorted + 1)) {
      bVar1 = strings[(long)sorted][depth];
      *(byte *)((long)__ptr + (long)sorted) = bVar1;
      bucketsize[(ulong)bVar1 - 1] = bucketsize[(ulong)bVar1 - 1] + 1;
    }
    __src = malloc(n << 3);
    for (i_2 = 1; i_2 < 0x100; i_2 = i_2 + 1) {
      bucketindex[i_2 - 1] = bucketsize[i_2 - 2] + bucketindex[i_2 - 2];
    }
    for (bsum = 0; bsum < n; bsum = bsum + 1) {
      puVar2 = strings[bsum];
      sVar3 = bucketindex[(ulong)*(byte *)((long)__ptr + bsum) - 1];
      bucketindex[(ulong)*(byte *)((long)__ptr + bsum) - 1] = sVar3 + 1;
      *(uchar **)((long)__src + sVar3 * 8) = puVar2;
    }
    memcpy(strings,__src,n << 3);
    free(__src);
    free(__ptr);
    puStack_1060 = oracle;
    for (local_1062 = 1; local_1062 < 0x100; local_1062 = local_1062 + 1) {
      if (bucketsize[(ulong)local_1062 - 1] != 0) {
        msd_CE1(strings + (long)puStack_1060,bucketsize[(ulong)local_1062 - 1],depth + 1);
        puStack_1060 = puStack_1060 + bucketsize[(ulong)local_1062 - 1];
      }
    }
  }
  return;
}

Assistant:

void
msd_CE1(unsigned char** strings, size_t n, size_t depth)
{
	if (n < 32) {
		insertion_sort(strings, n, depth);
		return;
	}
	size_t bucketsize[256] = {0};
	unsigned char* restrict oracle =
		(unsigned char*) malloc(n);
	for (size_t i=0; i < n; ++i)
		++bucketsize[oracle[i] = strings[i][depth]];
	unsigned char** restrict sorted = (unsigned char**)
		malloc(n*sizeof(unsigned char*));
	size_t bucketindex[256];
	bucketindex[0] = 0;
	for (size_t i=1; i < 256; ++i)
		bucketindex[i] = bucketindex[i-1]+bucketsize[i-1];
	for (size_t i=0; i < n; ++i)
		sorted[bucketindex[oracle[i]]++] = strings[i];
	memcpy(strings, sorted, n*sizeof(unsigned char*));
	free(sorted);
	free(oracle);
	size_t bsum = bucketsize[0];
	for (unsigned short i=1; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		msd_CE1(strings+bsum, bucketsize[i], depth+1);
		bsum += bucketsize[i];
	}
}